

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonrpcpp.hpp
# Opt level: O2

void __thiscall jsonrpcpp::Error::Error(Error *this,Json *json)

{
  bool bVar1;
  allocator<char> local_49;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_48;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Internal error",&local_49)
  ;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json(&local_48,(nullptr_t)0x0);
  Error(this,&local_38,-0x7f5b,&local_48);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_48);
  std::__cxx11::string::~string((string *)&local_38);
  bVar1 = nlohmann::operator!=<std::nullptr_t,_0>(json,(void *)0x0);
  if (bVar1) {
    parse_json(this,json);
  }
  return;
}

Assistant:

inline Error::Error(const Json& json) : Error("Internal error", -32603, nullptr)
{
    if (json != nullptr)
        Error::parse_json(json);
}